

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O0

bool LTAptDump(string *_aptId)

{
  ulong uVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  edgeTy eVar4;
  size_type sVar5;
  size_type sVar6;
  reference this;
  TaxiNode *pTVar7;
  TaxiNode *pTVar8;
  ostream *poVar9;
  long lVar10;
  size_t sVar11;
  char *pcVar12;
  TaxiNode *b;
  TaxiNode *a;
  TaxiEdge *e;
  const_iterator __end1_4;
  const_iterator __begin1_4;
  vecTaxiEdgeTy *__range1_4;
  TaxiNode *n;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  vecTaxiNodesTy *__range1_3;
  size_t i;
  StartupLoc *loc_1;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vecStartupLocTy *__range1_2;
  StartupLoc *loc;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vecStartupLocTy *__range1_1;
  RwyEndPt *re;
  const_iterator __end1;
  const_iterator __begin1;
  vecRwyEndPtTy *__range1;
  ofstream out;
  string fileName;
  Apt *apt;
  Apt *in_stack_fffffffffffff908;
  TaxiEdge *in_stack_fffffffffffff910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff918;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>_>
  *in_stack_fffffffffffff920;
  key_type *in_stack_fffffffffffff928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff930;
  Apt *in_stack_fffffffffffff938;
  char *local_560;
  char *local_558;
  char *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  __normal_iterator<const_TaxiEdge_*,_std::vector<TaxiEdge,_std::allocator<TaxiEdge>_>_> local_300;
  vecTaxiEdgeTy *local_2f8;
  reference local_2f0;
  TaxiNode *local_2e8;
  __normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_> local_2e0;
  vecTaxiNodesTy *local_2d8;
  ulong local_2d0;
  reference local_2c8;
  StartupLoc *local_2c0;
  __normal_iterator<const_StartupLoc_*,_std::vector<StartupLoc,_std::allocator<StartupLoc>_>_>
  local_2b8;
  vecStartupLocTy *local_2b0;
  reference local_2a8;
  StartupLoc *local_2a0;
  __normal_iterator<const_StartupLoc_*,_std::vector<StartupLoc,_std::allocator<StartupLoc>_>_>
  local_298;
  vecStartupLocTy *local_290;
  reference local_288;
  RwyEndPt *local_280;
  __normal_iterator<const_RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_> local_278;
  vecRwyEndPtTy *local_270;
  long local_268 [64];
  string local_68 [32];
  string local_48 [48];
  mapped_type *local_18;
  byte local_1;
  
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>_>
          ::count(in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  if (sVar5 == 0) {
    local_1 = 0;
  }
  else {
    local_18 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>_>
               ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>_>
                     *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    DataRefs::GetXPSystemPath_abi_cxx11_(&dataRefs);
    std::operator+(&in_stack_fffffffffffff938->id,in_stack_fffffffffffff930);
    std::operator+(in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910);
    std::__cxx11::string::~string(local_68);
    _Var3 = std::operator|(_S_out,_S_trunc);
    std::ofstream::ofstream(local_268,local_48,_Var3);
    std::operator<<((ostream *)local_268,
                    "type,BOT,symbol,color,rotation,latitude,longitude,time,speed,course,name,desc\n"
                   );
    std::ios_base::precision((ios_base *)((long)local_268 + *(long *)(local_268[0] + -0x18)),0xb);
    local_270 = Apt::GetRwyEndPtVec(local_18);
    local_278._M_current =
         (RwyEndPt *)
         std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>::begin
                   ((vector<RwyEndPt,_std::allocator<RwyEndPt>_> *)in_stack_fffffffffffff908);
    local_280 = (RwyEndPt *)
                std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>::end
                          ((vector<RwyEndPt,_std::allocator<RwyEndPt>_> *)in_stack_fffffffffffff908)
    ;
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>
                               *)in_stack_fffffffffffff910,
                              (__normal_iterator<const_RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>
                               *)in_stack_fffffffffffff908), bVar2) {
      local_288 = __gnu_cxx::
                  __normal_iterator<const_RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>
                  ::operator*(&local_278);
      poVar9 = std::operator<<((ostream *)local_268,"W,,");
      poVar9 = std::operator<<(poVar9,"arrow,");
      poVar9 = std::operator<<(poVar9,"red,");
      lVar10 = lround(local_288->heading);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,lVar10);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(local_288->super_TaxiNode).lat);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(local_288->super_TaxiNode).lon);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = std::operator<<(poVar9,",,,");
      poVar9 = std::operator<<(poVar9,(string *)&local_288->id);
      poVar9 = std::operator<<(poVar9,',');
      lVar10 = lround(local_288->heading);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,lVar10);
      poVar9 = std::operator<<(poVar9,anon_var_dwarf_100e79);
      std::operator<<(poVar9,"\n");
      __gnu_cxx::
      __normal_iterator<const_RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>::
      operator++(&local_278);
    }
    local_290 = Apt::GetStartupLocVec(local_18);
    local_298._M_current =
         (StartupLoc *)
         std::vector<StartupLoc,_std::allocator<StartupLoc>_>::begin
                   ((vector<StartupLoc,_std::allocator<StartupLoc>_> *)in_stack_fffffffffffff908);
    local_2a0 = (StartupLoc *)
                std::vector<StartupLoc,_std::allocator<StartupLoc>_>::end
                          ((vector<StartupLoc,_std::allocator<StartupLoc>_> *)
                           in_stack_fffffffffffff908);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_StartupLoc_*,_std::vector<StartupLoc,_std::allocator<StartupLoc>_>_>
                               *)in_stack_fffffffffffff910,
                              (__normal_iterator<const_StartupLoc_*,_std::vector<StartupLoc,_std::allocator<StartupLoc>_>_>
                               *)in_stack_fffffffffffff908), bVar2) {
      local_2a8 = __gnu_cxx::
                  __normal_iterator<const_StartupLoc_*,_std::vector<StartupLoc,_std::allocator<StartupLoc>_>_>
                  ::operator*(&local_298);
      poVar9 = std::operator<<((ostream *)local_268,"W,,");
      poVar9 = std::operator<<(poVar9,"wedge,");
      poVar9 = std::operator<<(poVar9,"orange,");
      lVar10 = lround(local_2a8->heading);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,lVar10);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(local_2a8->super_TaxiNode).lat);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(local_2a8->super_TaxiNode).lon);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = std::operator<<(poVar9,",,,");
      poVar9 = std::operator<<(poVar9,(string *)&local_2a8->id);
      poVar9 = std::operator<<(poVar9,',');
      lVar10 = lround(local_2a8->heading);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,lVar10);
      poVar9 = std::operator<<(poVar9,anon_var_dwarf_100e79);
      std::operator<<(poVar9,"\n");
      __gnu_cxx::
      __normal_iterator<const_StartupLoc_*,_std::vector<StartupLoc,_std::allocator<StartupLoc>_>_>::
      operator++(&local_298);
    }
    local_2b0 = Apt::GetStartupLocVec(local_18);
    local_2b8._M_current =
         (StartupLoc *)
         std::vector<StartupLoc,_std::allocator<StartupLoc>_>::begin
                   ((vector<StartupLoc,_std::allocator<StartupLoc>_> *)in_stack_fffffffffffff908);
    local_2c0 = (StartupLoc *)
                std::vector<StartupLoc,_std::allocator<StartupLoc>_>::end
                          ((vector<StartupLoc,_std::allocator<StartupLoc>_> *)
                           in_stack_fffffffffffff908);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_StartupLoc_*,_std::vector<StartupLoc,_std::allocator<StartupLoc>_>_>
                               *)in_stack_fffffffffffff910,
                              (__normal_iterator<const_StartupLoc_*,_std::vector<StartupLoc,_std::allocator<StartupLoc>_>_>
                               *)in_stack_fffffffffffff908), bVar2) {
      local_2c8 = __gnu_cxx::
                  __normal_iterator<const_StartupLoc_*,_std::vector<StartupLoc,_std::allocator<StartupLoc>_>_>
                  ::operator*(&local_2b8);
      poVar9 = std::operator<<((ostream *)local_268,"T,1,,");
      poVar9 = std::operator<<(poVar9,"orange,");
      lVar10 = lround(local_2c8->heading);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,lVar10);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(local_2c8->super_TaxiNode).lat);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(local_2c8->super_TaxiNode).lon);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = std::operator<<(poVar9,",,");
      lVar10 = lround(local_2c8->heading);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,lVar10);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = std::operator<<(poVar9,"Path leaving ");
      poVar9 = std::operator<<(poVar9,(string *)&local_2c8->id);
      poVar9 = std::operator<<(poVar9,',');
      lVar10 = lround(local_2c8->heading);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,lVar10);
      poVar9 = std::operator<<(poVar9,anon_var_dwarf_100e79);
      std::operator<<(poVar9,"\n");
      poVar9 = std::operator<<((ostream *)local_268,"T,0,,");
      poVar9 = std::operator<<(poVar9,"orange,");
      lVar10 = lround(local_2c8->heading);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,lVar10);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(local_2c8->viaPos).y);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(local_2c8->viaPos).x);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = std::operator<<(poVar9,",,");
      lVar10 = lround(local_2c8->heading);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,lVar10);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = std::operator<<(poVar9,',');
      std::operator<<(poVar9,"\n");
      __gnu_cxx::
      __normal_iterator<const_StartupLoc_*,_std::vector<StartupLoc,_std::allocator<StartupLoc>_>_>::
      operator++(&local_2b8);
    }
    local_2d0 = 0;
    local_2d8 = Apt::GetTaxiNodesVec(local_18);
    local_2e0._M_current =
         (TaxiNode *)
         std::vector<TaxiNode,_std::allocator<TaxiNode>_>::begin
                   ((vector<TaxiNode,_std::allocator<TaxiNode>_> *)in_stack_fffffffffffff908);
    local_2e8 = (TaxiNode *)
                std::vector<TaxiNode,_std::allocator<TaxiNode>_>::end
                          ((vector<TaxiNode,_std::allocator<TaxiNode>_> *)in_stack_fffffffffffff908)
    ;
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>
                               *)in_stack_fffffffffffff910,
                              (__normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>
                               *)in_stack_fffffffffffff908), bVar2) {
      local_2f0 = __gnu_cxx::
                  __normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>
                  ::operator*(&local_2e0);
      poVar9 = std::operator<<((ostream *)local_268,"W,,");
      sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_2f0->vecEdges)
      ;
      if (sVar6 == 0) {
        local_528 = "pin,";
      }
      else {
        sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          (&local_2f0->vecEdges);
        if (sVar6 == 1) {
          local_530 = "circle,";
        }
        else {
          sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            (&local_2f0->vecEdges);
          if (sVar6 == 2) {
            local_538 = "square,";
          }
          else {
            sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                              (&local_2f0->vecEdges);
            if (sVar6 == 3) {
              local_540 = "triangle,";
            }
            else {
              sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                (&local_2f0->vecEdges);
              local_540 = "star,";
              if (sVar6 == 4) {
                local_540 = "diamond,";
              }
            }
            local_538 = local_540;
          }
          local_530 = local_538;
        }
        local_528 = local_530;
      }
      poVar9 = std::operator<<(poVar9,local_528);
      bVar2 = Apt::IsConnectedToRwy(in_stack_fffffffffffff938,(size_t)in_stack_fffffffffffff930);
      if (bVar2) {
        local_558 = "red,";
      }
      else {
        sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          (&local_2f0->vecEdges);
        if (sVar6 == 2) {
          local_560 = "blue,";
        }
        else {
          local_560 = "aqua,";
        }
        local_558 = local_560;
      }
      poVar9 = std::operator<<(poVar9,local_558);
      poVar9 = std::operator<<(poVar9,"0,");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_2f0->lat);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_2f0->lon);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = std::operator<<(poVar9,",,,");
      poVar9 = std::operator<<(poVar9,"Node ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_2d0);
      poVar9 = std::operator<<(poVar9,',');
      sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_2f0->vecEdges)
      ;
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar6);
      poVar9 = std::operator<<(poVar9," edges");
      std::operator<<(poVar9,"\n");
      local_2d0 = local_2d0 + 1;
      __gnu_cxx::
      __normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>::
      operator++(&local_2e0);
    }
    local_2d0 = 0;
    local_2f8 = Apt::GetTaxiEdgeVec(local_18);
    local_300._M_current =
         (TaxiEdge *)
         std::vector<TaxiEdge,_std::allocator<TaxiEdge>_>::begin
                   ((vector<TaxiEdge,_std::allocator<TaxiEdge>_> *)in_stack_fffffffffffff908);
    std::vector<TaxiEdge,_std::allocator<TaxiEdge>_>::end
              ((vector<TaxiEdge,_std::allocator<TaxiEdge>_> *)in_stack_fffffffffffff908);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_TaxiEdge_*,_std::vector<TaxiEdge,_std::allocator<TaxiEdge>_>_>
                               *)in_stack_fffffffffffff910,
                              (__normal_iterator<const_TaxiEdge_*,_std::vector<TaxiEdge,_std::allocator<TaxiEdge>_>_>
                               *)in_stack_fffffffffffff908), bVar2) {
      this = __gnu_cxx::
             __normal_iterator<const_TaxiEdge_*,_std::vector<TaxiEdge,_std::allocator<TaxiEdge>_>_>
             ::operator*(&local_300);
      pTVar7 = TaxiEdge::GetA(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      pTVar8 = TaxiEdge::GetB(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      poVar9 = std::operator<<((ostream *)local_268,"T,1,,");
      eVar4 = TaxiEdge::GetType(this);
      pcVar12 = "blue,";
      if (eVar4 == RUN_WAY) {
        pcVar12 = "red,";
      }
      poVar9 = std::operator<<(poVar9,pcVar12);
      lVar10 = lround(this->angle);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,lVar10);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pTVar7->lat);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pTVar7->lon);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = std::operator<<(poVar9,",,");
      lVar10 = lround(this->angle);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,lVar10);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = std::operator<<(poVar9,"Edge ");
      uVar1 = local_2d0;
      local_2d0 = local_2d0 + 1;
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar1);
      poVar9 = std::operator<<(poVar9,',');
      lVar10 = lround(this->angle);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,lVar10);
      poVar9 = std::operator<<(poVar9,anon_var_dwarf_100fa1);
      sVar11 = TaxiEdge::startNode(this);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar11);
      poVar9 = std::operator<<(poVar9,'-');
      sVar11 = TaxiEdge::endNode(this);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar11);
      std::operator<<(poVar9,"\n");
      poVar9 = std::operator<<((ostream *)local_268,"T,0,,");
      eVar4 = TaxiEdge::GetType(this);
      pcVar12 = "blue,";
      if (eVar4 == RUN_WAY) {
        pcVar12 = "red,";
      }
      poVar9 = std::operator<<(poVar9,pcVar12);
      lVar10 = lround(this->angle);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,lVar10);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pTVar8->lat);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pTVar8->lon);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = std::operator<<(poVar9,",,");
      lVar10 = lround(this->angle);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,lVar10);
      poVar9 = std::operator<<(poVar9,',');
      in_stack_fffffffffffff910 = (TaxiEdge *)std::operator<<(poVar9,',');
      std::operator<<((ostream *)in_stack_fffffffffffff910,"\n");
      __gnu_cxx::
      __normal_iterator<const_TaxiEdge_*,_std::vector<TaxiEdge,_std::allocator<TaxiEdge>_>_>::
      operator++(&local_300);
    }
    std::ofstream::close();
    local_1 = 1;
    std::ofstream::~ofstream(local_268);
    std::__cxx11::string::~string(local_48);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool LTAptDump (const std::string& _aptId)
{
    // find the airport by id
    if (gmapApt.count(_aptId) < 1) return false;
    try {
        const Apt& apt = gmapApt.at(_aptId);
        
        // open the output file
        const std::string fileName (dataRefs.GetXPSystemPath() + _aptId + ".csv");
        std::ofstream out (fileName, std::ios_base::out | std::ios_base::trunc);
        // column headers
        out << "type,BOT,symbol,color,rotation,latitude,longitude,time,speed,course,name,desc\n";
        out.precision(11);               // precision is all digits, so we need something like 123.45678901
        
        // Dump all rwy endpoints as Waypoints
        for (const RwyEndPt& re: apt.GetRwyEndPtVec())
            out
            << "W,,"                                    // type, BOT
            << "arrow,"                                 // symbol
            << "red,"                                   // color
            << std::lround(re.heading) << ','           // rotation
            << re.lat << ',' << re.lon << ','           // latitude,longitude
            << ",,,"                                    // time,speed,course
            << re.id << ','                             // name
            << std::lround(re.heading) << "°,"          // desc
            << "\n";
        
        // Dump all startup locations as Waypoints
        for (const StartupLoc& loc: apt.GetStartupLocVec())
            out
            << "W,,"                                    // type, BOT
            << "wedge,"                                 // symbol
            << "orange,"                                // color
            << std::lround(loc.heading) << ','          // rotation
            << loc.lat << ',' << loc.lon << ','         // latitude,longitude
            << ",,,"                                    // time,speed,course
            << loc.id << ','                            // name
            << std::lround(loc.heading) << "°,"         // desc
            << "\n";
        
        // Dump all startup paths as tracks
        for (const StartupLoc& loc: apt.GetStartupLocVec())
        {
            out
            << "T,1,,"                                  // type, BOT, symbol
            << "orange,"                                // color
            << std::lround(loc.heading) << ','          // rotation
            << loc.lat << ',' << loc.lon << ','         // latitude,longitude
            << ",,"                                     // time,speed
            << std::lround(loc.heading) << ','          // course
            << "Path leaving " << loc.id << ','         // name
            << std::lround(loc.heading) << "°,"         // desc
            << "\n";

            out
            << "T,0,,"                                  // type, BOT, symbol
            << "orange,"                                // color
            << std::lround(loc.heading) << ','          // rotation
            << loc.viaPos.y << ',' << loc.viaPos.x << ','  // latitude,longitude
            << ",,"                                     // time,speed
            << std::lround(loc.heading) << ','          // course
            << ','                                      // name, desc
            << "\n";

        }
        
        // Dump all nodes as Waypoints
        size_t i = 0;
        for (const TaxiNode& n: apt.GetTaxiNodesVec()) {
            out
            << "W,,"                                    // type, BOT
            << (n.vecEdges.size() == 0 ? "pin," :       // symbol
                n.vecEdges.size() == 1 ? "circle," :
                n.vecEdges.size() == 2 ? "square," :
                n.vecEdges.size() == 3 ? "triangle," :
                n.vecEdges.size() == 4 ? "diamond," : "star,")
            << (apt.IsConnectedToRwy(i) ? "red," :        // color: red if rwy, blue if 2 edges, else auqa
                n.vecEdges.size() == 2 ? "blue," : "aqua,")
            << "0,"                                     // rotation
            << n.lat << ',' << n.lon << ','             // latitude,longitude
            << ",,,"                                    // time,speed,course
            << "Node " << i << ','                      // name
            << n.vecEdges.size() << " edges"            // desc
            << "\n";
            i++;
        }
        
        // Dump all edges as Tracks
        i = 0;
        for (const TaxiEdge& e: apt.GetTaxiEdgeVec())
        {
            const TaxiNode& a = e.GetA(apt);
            const TaxiNode& b = e.GetB(apt);
            
            out
            << "T,1,,"                                  // type, BOT, symbol
            << (e.GetType() == TaxiEdge::RUN_WAY ? "red," : "blue,")  // color
            << std::lround(e.angle) << ','              // rotation
            << a.lat << ',' << a.lon << ','             // latitude,longitude
            << ",,"                                     // time,speed
            << std::lround(e.angle) << ','              // course
            << "Edge " << (i++) << ','                  // name
            << std::lround(e.angle) << "°, nodes " << e.startNode() << '-' << e.endNode() // desc
            << "\n";

            out
            << "T,0,,"                                  // type, BOT, symbol
            << (e.GetType() == TaxiEdge::RUN_WAY ? "red," : "blue,")  // color
            << std::lround(e.angle) << ','              // rotation
            << b.lat << ',' << b.lon << ','             // latitude,longitude
            << ",,"                                     // time,speed
            << std::lround(e.angle) << ','              // course
            << ','                                      // name, desc
            << "\n";

        }
            
#ifdef DEBUG
        // Dump all Bezier handles
        for (auto iter = apt.vecBezierHandles.cbegin();
             iter != apt.vecBezierHandles.cend();
             ++iter)
        {
            const TaxiNode& a = *iter;
            const TaxiNode& b = *(++iter);
            
            out
            << "T,1,,"                                  // type, BOT, symbol
            << (a.bVisited ? "orange," : "magenta,")    // color (mirrored control point or not?)
            <<  ','                                     // rotation
            << a.lat << ',' << a.lon << ','             // latitude,longitude
            << ",,"                                     // time,speed
            << ','                                      // course
            << "Bezier Handle Ln " << a.prevIdx << ','  // name
            << (a.bVisited ? "mirrored" : "")           // desc
            << "\n";

            out
            << "T,0,,"                                  // type, BOT, symbol
            << (a.bVisited ? "orange," : "magenta,")    // color (mirrored control point or not?)
            <<  ','                                     // rotation
            << b.lat << ',' << b.lon << ','             // latitude,longitude
            << ",,"                                     // time,speed
            << ','                                      // course
            << ','                                      // name, desc
            << "\n";
        }
#endif
        
        // Close the file
        out.close();
        return true;
    }
    catch (...) {
        return false;
    }
}